

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O0

HighsDebugStatus
debugDualSolutionRightSize(HighsOptions *options,HighsLp *lp,HighsSolution *solution)

{
  bool bVar1;
  HighsLp *in_RDX;
  long in_RDI;
  bool right_size;
  HighsDebugStatus return_status;
  uint in_stack_ffffffffffffffd8;
  HighsDebugStatus local_4;
  
  if (*(int *)(in_RDI + 0x15c) < 1) {
    local_4 = kNotChecked;
  }
  else {
    local_4 = kOk;
    bVar1 = isDualSolutionRightSize(in_RDX,(HighsSolution *)(ulong)in_stack_ffffffffffffffd8);
    if (!bVar1) {
      highsLogUser((HighsLogOptions *)(in_RDI + 0x380),kError,"HiGHS dual solution size error\n");
      local_4 = kLogicalError;
    }
  }
  return local_4;
}

Assistant:

HighsDebugStatus debugDualSolutionRightSize(const HighsOptions& options,
                                            const HighsLp& lp,
                                            const HighsSolution& solution) {
  if (options.highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  bool right_size = isDualSolutionRightSize(lp, solution);
  if (!right_size) {
    highsLogUser(options.log_options, HighsLogType::kError,
                 "HiGHS dual solution size error\n");
    assert(right_size);
    return_status = HighsDebugStatus::kLogicalError;
  }
  return return_status;
}